

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

quintptr __thiscall QDockAreaLayoutInfo::currentTabId(QDockAreaLayoutInfo *this)

{
  int index;
  unsigned_long_long uVar1;
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->tabbed == true) && (this->tabBar != (QTabBar *)0x0)) {
    index = QTabBar::currentIndex(this->tabBar);
    if (index != -1) {
      QTabBar::tabData(&QStack_38,this->tabBar,index);
      uVar1 = qvariant_cast<unsigned_long_long>(&QStack_38);
      ::QVariant::~QVariant(&QStack_38);
      goto LAB_003c9c43;
    }
  }
  uVar1 = 0;
LAB_003c9c43:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

quintptr QDockAreaLayoutInfo::currentTabId() const
{
    if (!tabbed || tabBar == nullptr)
        return 0;

    int index = tabBar->currentIndex();
    if (index == -1)
        return 0;

    return qvariant_cast<quintptr>(tabBar->tabData(index));
}